

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

uint32_t helper_bcdus_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  _Bool ox_flag;
  uint64_t local_18;
  uint64_t uStack_10;
  
  ox_flag = false;
  local_18 = b->u64[0];
  uStack_10 = b->u64[1];
  uVar4 = 0;
  do {
    bVar2 = b->u8[uVar4 >> 1] >> 4;
    if ((uVar4 & 1) == 0) {
      bVar2 = b->u8[uVar4 >> 1] & 0xe;
    }
    if (9 < bVar2) {
      return 1;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x20);
  cVar1 = a->s8[8];
  iVar5 = (int)cVar1;
  if (iVar5 < 0x20) {
    if (cVar1 < -0x1f) goto LAB_004bc4f5;
    if (cVar1 < '\x01') {
      urshift(&local_18,&uStack_10,iVar5 * -4);
    }
    else {
      ulshift(&local_18,&uStack_10,iVar5 << 2,&ox_flag);
    }
  }
  else {
    ox_flag = true;
LAB_004bc4f5:
    local_18 = 0;
    uStack_10 = 0;
  }
  r->u64[0] = local_18;
  r->u64[1] = uStack_10;
  if (r->u64[1] == 0) {
    uVar3 = r->u64[0];
    if (uVar3 < 0x10) {
      uVar4 = 2;
      goto LAB_004bc537;
    }
  }
  else {
    uVar3 = (ulong)r->u8[0];
  }
  bVar2 = ((byte)uVar3 & 0xf) - 10;
  if (bVar2 < 6) {
    uVar4 = *(uint *)(&DAT_00dac28c + (ulong)bVar2 * 4);
  }
  else {
    uVar4 = 8;
  }
LAB_004bc537:
  return ox_flag | uVar4;
}

Assistant:

uint32_t helper_bcdus(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int i;
    int invalid = 0;
    bool ox_flag = false;
    ppc_avr_t ret = *b;

    for (i = 0; i < 32; i++) {
        bcd_get_digit(b, i, &invalid);

        if (unlikely(invalid)) {
            return CRF_SO;
        }
    }

    i = a->VsrSB(7);
    if (i >= 32) {
        ox_flag = true;
        ret.VsrD(1) = ret.VsrD(0) = 0;
    } else if (i <= -32) {
        ret.VsrD(1) = ret.VsrD(0) = 0;
    } else if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);
    }
    *r = ret;

    cr = bcd_cmp_zero(r);
    if (ox_flag) {
        cr |= CRF_SO;
    }

    return cr;
}